

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

RunData<unsigned_long> * __thiscall
anon_unknown.dwarf_7def3::InitData<unsigned_long>::run_data
          (RunData<unsigned_long> *__return_storage_ptr__,InitData<unsigned_long> *this,
          uint32_t array_size)

{
  RunData<unsigned_long> *extraout_RAX;
  uint in_ECX;
  undefined4 in_register_00000014;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  __first;
  ulong __n;
  allocator_type local_2c;
  allocator_type local_2b;
  allocator_type local_2a;
  allocator_type local_29;
  
  __first._M_current._4_4_ = in_register_00000014;
  __first._M_current._0_4_ = array_size;
  __n = (ulong)in_ECX;
  std::vector<unsigned_long,std::allocator<unsigned_long>>::
  vector<__gnu_cxx::__normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,void>
            ((vector<unsigned_long,std::allocator<unsigned_long>> *)__return_storage_ptr__,
             (__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )this,(__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                     )(&(this->keys_).
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_start + __n),&local_29);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&__return_storage_ptr__->keys1_,__n,&local_2a);
  std::vector<unsigned_int,std::allocator<unsigned_int>>::
  vector<__gnu_cxx::__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,void>
            ((vector<unsigned_int,std::allocator<unsigned_int>> *)&__return_storage_ptr__->values0_,
             __first,(__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                      )(__first._M_current + __n),&local_2b);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&__return_storage_ptr__->values1_,__n,&local_2c);
  return extraout_RAX;
}

Assistant:

RunData<KeyType> run_data(uint32_t array_size) const 
    {
        assert(array_size <= MAX_SIZE);
        return RunData<KeyType>(array_size, keys_.begin(), values_.begin());
    }